

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O3

bool __thiscall
iDynTree::SimpleLeggedOdometry::changeFixedFrame
          (SimpleLeggedOdometry *this,FrameIndex newFixedFrame)

{
  long lVar1;
  char *pcVar2;
  Transform world_H_newFixed;
  Transform oldFixed_H_newFixed;
  Transform world_H_oldFixed;
  Transform local_150 [96];
  Transform local_f0 [96];
  Transform local_90 [96];
  
  if (this->m_kinematicsUpdated == false) {
    pcVar2 = "changeFixedFrame was called, but the kinematics info was never setted.";
  }
  else {
    lVar1 = iDynTree::Model::getFrameLink((long)this);
    if (lVar1 != LINK_INVALID_INDEX) {
      iDynTree::Transform::Transform(local_90,&this->m_world_H_fixedLink);
      iDynTree::LinkPositions::operator()(&this->m_base_H_link,this->m_fixedLinkIndex);
      iDynTree::Transform::inverse();
      iDynTree::LinkPositions::operator()(&this->m_base_H_link,lVar1);
      iDynTree::Transform::operator*(local_f0,local_150);
      iDynTree::Transform::operator*(local_150,local_90);
      iDynTree::Transform::operator=(&this->m_world_H_fixedLink,local_150);
      this->m_fixedLinkIndex = lVar1;
      return true;
    }
    pcVar2 = "changeFixedFrame was called, but the provided new fixed frame is unknown.";
  }
  iDynTree::reportError("SimpleLeggedOdometry","changeFixedFrame",pcVar2);
  return false;
}

Assistant:

bool SimpleLeggedOdometry::changeFixedFrame(const FrameIndex newFixedFrame)
{
    if( !this->m_kinematicsUpdated )
    {
        reportError("SimpleLeggedOdometry",
                    "changeFixedFrame",
                    "changeFixedFrame was called, but the kinematics info was never setted.");
        return false;
    }

    LinkIndex newFixedLink = this->m_model.getFrameLink(newFixedFrame);

    if( newFixedLink == LINK_INVALID_INDEX )
    {
        reportError("SimpleLeggedOdometry",
                    "changeFixedFrame",
                    "changeFixedFrame was called, but the provided new fixed frame is unknown.");
        return false;
    }

    Transform world_H_oldFixed = this->m_world_H_fixedLink;
    LinkIndex oldFixedLink = m_fixedLinkIndex;
    Transform oldFixed_H_newFixed = m_base_H_link(oldFixedLink).inverse()*m_base_H_link(newFixedLink);
    Transform world_H_newFixed = world_H_oldFixed*oldFixed_H_newFixed;
    this->m_world_H_fixedLink = world_H_newFixed;
    this->m_fixedLinkIndex = newFixedLink;

    return true;
}